

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigslot.h
# Opt level: O3

void __thiscall
sigslot::
_signal_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>
::disconnect_all(_signal_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>
                 *this)

{
  connections_list *__last;
  has_slots<sigslot::multi_threaded_local> *this_00;
  const_iterator __first;
  
  (*(this->super__signal_base<sigslot::multi_threaded_local>).super_multi_threaded_local.
    _vptr_multi_threaded_local[2])();
  __last = &this->m_connected_slots;
  __first._M_node =
       (this->m_connected_slots).
       super__List_base<sigslot::_connection_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>_*,_std::allocator<sigslot::_connection_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>_*>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  if (__first._M_node != (_List_node_base *)__last) {
    do {
      this_00 = (has_slots<sigslot::multi_threaded_local> *)
                (*(code *)(__first._M_node[1]._M_next)->_M_next[1]._M_next)();
      has_slots<sigslot::multi_threaded_local>::signal_disconnect
                (this_00,&this->super__signal_base<sigslot::multi_threaded_local>);
      if (__first._M_node[1]._M_next != (_List_node_base *)0x0) {
        (*(code *)(__first._M_node[1]._M_next)->_M_next->_M_prev)();
      }
      __first._M_node = (__first._M_node)->_M_next;
    } while (__first._M_node != (_List_node_base *)__last);
    __first._M_node =
         (__last->
         super__List_base<sigslot::_connection_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>_*,_std::allocator<sigslot::_connection_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>_*>_>
         )._M_impl._M_node.super__List_node_base._M_next;
  }
  std::__cxx11::
  list<sigslot::_connection_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>_*,_std::allocator<sigslot::_connection_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>_*>_>
  ::erase(__last,__first,(const_iterator)__last);
  (*(this->super__signal_base<sigslot::multi_threaded_local>).super_multi_threaded_local.
    _vptr_multi_threaded_local[3])(this);
  return;
}

Assistant:

void disconnect_all()
		{
			lock_block<mt_policy> lock(this);
			const_iterator it = m_connected_slots.begin();
			const_iterator itEnd = m_connected_slots.end();

			while(it != itEnd)
			{
				(*it)->getdest()->signal_disconnect(this);
				delete *it;

				++it;
			}

			m_connected_slots.erase(m_connected_slots.begin(), m_connected_slots.end());
		}